

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool duckdb::FromCStringCastWrapper<duckdb::TryCast>::Operation<char*,long>
               (char *input_str,long *result)

{
  bool bVar1;
  undefined1 in_R8B;
  string_t input_00;
  string_t input;
  anon_union_16_2_67f50693_for_value local_20;
  
  string_t::string_t((string_t *)&local_20.pointer,input_str);
  input_00.value.pointer.ptr = (char *)result;
  input_00.value._0_8_ = local_20.pointer.ptr;
  bVar1 = TryCast::Operation<duckdb::string_t,long>
                    ((TryCast *)local_20._0_8_,input_00,(int64_t *)0x0,(bool)in_R8B);
  return bVar1;
}

Assistant:

static bool Operation(SOURCE_TYPE input_str, RESULT_TYPE &result) {
		string_t input(input_str);
		return OP::template Operation<string_t, RESULT_TYPE>(input, result);
	}